

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,xmlSchemaParserCtxtPtr ctxt)

{
  int iVar1;
  xmlSchemaParserCtxtPtr ctxt_local;
  xmlSchemaElementPtr elemDecl_local;
  
  if ((elemDecl != (xmlSchemaElementPtr)0x0) && ((elemDecl->flags & 0x40000U) == 0)) {
    elemDecl->flags = elemDecl->flags | 0x40000;
    iVar1 = xmlSchemaCheckElemPropsCorrect(ctxt,elemDecl);
    if (iVar1 == 0) {
      xmlSchemaCheckElemSubstGroup(ctxt,elemDecl);
    }
  }
  return;
}

Assistant:

static void
xmlSchemaCheckElementDeclComponent(xmlSchemaElementPtr elemDecl,
				   xmlSchemaParserCtxtPtr ctxt)
{
    if (elemDecl == NULL)
	return;
    if (elemDecl->flags & XML_SCHEMAS_ELEM_INTERNAL_CHECKED)
	return;
    elemDecl->flags |= XML_SCHEMAS_ELEM_INTERNAL_CHECKED;
    if (xmlSchemaCheckElemPropsCorrect(ctxt, elemDecl) == 0) {
	/*
	* Adds substitution group members.
	*/
	xmlSchemaCheckElemSubstGroup(ctxt, elemDecl);
    }
}